

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ForkBranchBase::releaseHub(ForkBranchBase *this,ExceptionOrValue *output)

{
  uint *puVar1;
  ForkHubBase *node;
  Exception *exception;
  NullableValue<kj::Exception> _exception2536;
  
  node = (this->hub).ptr;
  if (node != (ForkHubBase *)0x0) {
    (this->hub).ptr = (ForkHubBase *)0x0;
    puVar1 = &node->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      PromiseDisposer::dispose(&node->super_PromiseArenaMember);
    }
  }
  return;
}

Assistant:

void ForkBranchBase::releaseHub(ExceptionOrValue& output) {
  KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
    hub = nullptr;
  })) {
    output.addException(kj::mv(exception));
  }
}